

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O2

I32 __thiscall Omega_h::Comm::rank(Comm *this)

{
  return 0;
}

Assistant:

I32 Comm::rank() const {
#ifdef OMEGA_H_USE_MPI
  I32 r;
  CALL(MPI_Comm_rank(impl_, &r));
  return r;
#else
  return 0;
#endif
}